

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_chasm_bin.cpp
# Opt level: O0

bool __thiscall FChasmBinFile::ReadNextEntry(FChasmBinFile *this,DWORD index)

{
  FileReader *pFVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  char *copyStr;
  bool local_49;
  FResourceLump *pFStack_48;
  bool supportedFormat;
  FResourceLump *lump;
  long bytesRead;
  undefined7 uStack_30;
  ChasmBinEntry entry;
  DWORD index_local;
  FChasmBinFile *this_local;
  
  pFVar1 = (this->super_FResourceFile).Reader;
  entry.size = index;
  unique0x10000263 = this;
  iVar4 = (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[2])
                    (pFVar1,(long)&bytesRead + 7,0x15);
  lump = (FResourceLump *)CONCAT44(extraout_var,iVar4);
  if (lump == (FResourceLump *)0x15) {
    uVar2._3_1_ = entry.name[4];
    uVar2._0_1_ = entry.name[1];
    uVar2._1_1_ = entry.name[2];
    uVar2._2_1_ = entry.name[3];
    bytesRead._7_1_ = (undefined1)uStack_30;
    uStack_30 = (undefined7)(CONCAT17(entry.name[0],uStack_30) >> 8);
    entry.name[4] = '\0';
    pFStack_48 = (FResourceLump *)0x0;
    entry.name._0_4_ = uVar2;
    bVar3 = anon_unknown.dwarf_6a53ed::HasExtension((char *)((long)&bytesRead + 7),"PCM");
    if (((bVar3) ||
        (bVar3 = anon_unknown.dwarf_6a53ed::HasExtension((char *)((long)&bytesRead + 7),"RAW"),
        bVar3)) ||
       (bVar3 = anon_unknown.dwarf_6a53ed::HasExtension((char *)((long)&bytesRead + 7),"SFX"), bVar3
       )) {
      pFStack_48 = MakeRawSoundLump(this,(ChasmBinEntry *)((long)&bytesRead + 7));
      local_49 = true;
    }
    else {
      bVar3 = anon_unknown.dwarf_6a53ed::HasExtension((char *)((long)&bytesRead + 7),"WAV");
      if (bVar3) {
        pFStack_48 = MakeWaveSoundLump(this,(ChasmBinEntry *)((long)&bytesRead + 7));
        local_49 = true;
      }
      else {
        pFStack_48 = MakeUncompressedLump(this,(ChasmBinEntry *)((long)&bytesRead + 7));
        local_49 = anon_unknown.dwarf_6a53ed::HasExtension((char *)((long)&bytesRead + 7),"CEL");
      }
    }
    pFStack_48->Owner = &this->super_FResourceFile;
    pFStack_48->LumpSize = entry.name._5_4_;
    copyStr = copystring((char *)((long)&bytesRead + 7));
    FString::operator=(&pFStack_48->FullName,copyStr);
    if (local_49 != false) {
      anon_unknown.dwarf_6a53ed::CopyBaseName
                ((pFStack_48->field_3).Name,(char *)((long)&bytesRead + 7));
    }
    TArray<FResourceLump_*,_FResourceLump_*>::Push(&this->m_lumps,&stack0xffffffffffffffb8);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FChasmBinFile::ReadNextEntry(const DWORD index)
{
	ChasmBinEntry entry;

	const long bytesRead = Reader->Read(&entry, long(sizeof entry));
	if (size_t(bytesRead) != sizeof entry)
	{
		return false;
	}

	// Convert Pascal string to zero-terminated
	memmove(entry.name, &entry.name[1], sizeof entry.name - 1);
	entry.name[sizeof entry.name - 1] = '\0';

	FResourceLump* lump = NULL;
	bool supportedFormat = false;

	if (   HasExtension(entry.name, "PCM")
		|| HasExtension(entry.name, "RAW")
		|| HasExtension(entry.name, "SFX"))
	{
		lump = MakeRawSoundLump(entry);
		supportedFormat = true;
	}
	else if (HasExtension(entry.name, "WAV"))
	{
		lump = MakeWaveSoundLump(entry);
		supportedFormat = true;
	}
	else
	{
		lump = MakeUncompressedLump(entry);
		supportedFormat = HasExtension(entry.name, "CEL");
	}

	// Set common lump parameters

	lump->Owner    = this;
	lump->LumpSize = LittleLong(entry.size);
	lump->FullName = copystring(entry.name);

	// TODO: namespace

	if (supportedFormat)
	{
		CopyBaseName(lump->Name, entry.name);
	}

	m_lumps.Push(lump);

	return true;
}